

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_matrixToQuat(float *matrix,float *quat)

{
  int iVar1;
  QUAT_INDEX QVar2;
  float fVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  float qa [4];
  undefined1 auVar13 [16];
  undefined1 extraout_var [60];
  
  fVar11 = *matrix;
  fVar12 = matrix[5];
  fVar3 = fVar11 + fVar12 + matrix[10];
  if (fVar3 <= 0.0) {
    uVar10 = 2;
    if (matrix[10] <= *(float *)((long)matrix + (ulong)((uint)(fVar11 < fVar12) * 0x14))) {
      uVar10 = (ulong)(fVar11 < fVar12);
    }
    uVar6 = (uint)uVar10;
    uVar7 = uVar6 * 4;
    iVar1 = *(int *)((long)dgQuaternion::dgQuaternion::QIndex + (ulong)uVar7);
    lVar8 = (long)iVar1;
    QVar2 = dgQuaternion::dgQuaternion::QIndex[lVar8];
    lVar9 = (long)(int)QVar2;
    fVar11 = (*(float *)((long)matrix + (ulong)(uVar6 * 0x14)) -
             (matrix[lVar8 * 5] + matrix[lVar9 * 5])) + 1.0;
    if (fVar11 < 0.0) {
      auVar14._0_4_ = sqrtf(fVar11);
      auVar14._4_60_ = extraout_var;
      auVar13 = auVar14._0_16_;
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    }
    fVar11 = auVar13._0_4_;
    qa[uVar10] = fVar11 * 0.5;
    auVar15._0_12_ = ZEXT812(0);
    auVar15._12_4_ = 0;
    uVar4 = vcmpss_avx512f(auVar13,auVar15,4);
    bVar5 = (bool)((byte)uVar4 & 1);
    fVar11 = (float)((uint)bVar5 * (int)(0.5 / fVar11) + (uint)!bVar5 * (int)fVar11);
    qa[3] = fVar11 * (matrix[lVar8 * 4 + lVar9] - matrix[lVar9 * 4 + lVar8]);
    qa[lVar8] = fVar11 * (matrix[(int)(uVar7 + iVar1)] + matrix[(int)((uint)(lVar8 * 4) | uVar6)]);
    qa[lVar9] = fVar11 * (matrix[(int)(QVar2 + uVar7)] + matrix[(int)((uint)(lVar9 * 4) | uVar6)]);
    *(undefined8 *)quat = qa._0_8_;
    quat[3] = qa[3];
  }
  else {
    fVar3 = fVar3 + 1.0;
    if (fVar3 < 0.0) {
      fVar11 = sqrtf(fVar3);
    }
    else {
      auVar13 = vsqrtss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
      fVar11 = auVar13._0_4_;
    }
    fVar12 = 0.5 / fVar11;
    quat[3] = fVar11 * 0.5;
    *quat = fVar12 * (matrix[6] - matrix[9]);
    quat[1] = fVar12 * (matrix[8] - matrix[2]);
    qa[2] = fVar12 * (matrix[1] - matrix[4]);
  }
  quat[2] = qa[2];
  return;
}

Assistant:

void fm_matrixToQuat(const float *matrix,float *quat) // convert the 3x3 portion of a 4x4 matrix into a quaternion as x,y,z,w
{

	float tr = matrix[0*4+0] + matrix[1*4+1] + matrix[2*4+2];

	// check the diagonal

	if (tr > 0.0f )
	{
		float s = (float) sqrt ( (double) (tr + 1.0f) );
		quat[3] = s * 0.5f;
		s = 0.5f / s;
		quat[0] = (matrix[1*4+2] - matrix[2*4+1]) * s;
		quat[1] = (matrix[2*4+0] - matrix[0*4+2]) * s;
		quat[2] = (matrix[0*4+1] - matrix[1*4+0]) * s;

	}
	else
	{
		// diagonal is negative
		int nxt[3] = {1, 2, 0};
		float  qa[4];

		int i = 0;

		if (matrix[1*4+1] > matrix[0*4+0]) i = 1;
		if (matrix[2*4+2] > matrix[i*4+i]) i = 2;

		int j = nxt[i];
		int k = nxt[j];

		float s = sqrtf ( ((matrix[i*4+i] - (matrix[j*4+j] + matrix[k*4+k])) + 1.0f) );

		qa[i] = s * 0.5f;

		if (s != 0.0f ) s = 0.5f / s;

		qa[3] = (matrix[j*4+k] - matrix[k*4+j]) * s;
		qa[j] = (matrix[i*4+j] + matrix[j*4+i]) * s;
		qa[k] = (matrix[i*4+k] + matrix[k*4+i]) * s;

		quat[0] = qa[0];
		quat[1] = qa[1];
		quat[2] = qa[2];
		quat[3] = qa[3];
	}


}